

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 617_mergeTwoBinaryTrees.cpp
# Opt level: O2

void printnode(TreeNode *root)

{
  ostream *poVar1;
  value_type in_RDI;
  queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> q;
  value_type local_70;
  _Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_> local_68;
  
  local_70 = in_RDI;
  std::queue<TreeNode*,std::deque<TreeNode*,std::allocator<TreeNode*>>>::
  queue<std::deque<TreeNode*,std::allocator<TreeNode*>>,void>
            ((queue<TreeNode_*,_std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>_> *)&local_68);
  std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
            ((deque<TreeNode_*,_std::allocator<TreeNode_*>_> *)&local_68,&local_70);
  while (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_68._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_70 = *local_68._M_impl.super__Deque_impl_data._M_start._M_cur;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_70->val);
    std::operator<<(poVar1,", ");
    std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>::pop_front
              ((deque<TreeNode_*,_std::allocator<TreeNode_*>_> *)&local_68);
    if (local_70->left != (TreeNode *)0x0) {
      std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                ((deque<TreeNode_*,_std::allocator<TreeNode_*>_> *)&local_68,&local_70->left);
    }
    if (local_70->right != (TreeNode *)0x0) {
      std::deque<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                ((deque<TreeNode_*,_std::allocator<TreeNode_*>_> *)&local_68,&local_70->right);
    }
  }
  std::_Deque_base<TreeNode_*,_std::allocator<TreeNode_*>_>::~_Deque_base(&local_68);
  return;
}

Assistant:

void printnode(TreeNode* root)
{
	queue<TreeNode*> q;
	q.push(root);
	while (q.empty()==false)
	{
		root = q.front();
		cout<<root->val<<", ";
		q.pop();
		if (root->left!=nullptr)
			q.push(root->left);
		if (root->right!=nullptr)
			q.push(root->right);
	}
}